

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O3

SessionFactory *
FileReceiveSession::create_session_factory(SessionFactory *__return_storage_ptr__,path *target)

{
  pointer pcVar1;
  long *plVar2;
  long *local_30;
  long local_28;
  long local_20;
  long lStack_18;
  
  pcVar1 = (target->m_pathname)._M_dataplus._M_p;
  local_30 = &local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + (target->m_pathname)._M_string_length);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  plVar2 = (long *)operator_new(0x20);
  *plVar2 = (long)(plVar2 + 2);
  if (local_30 == &local_20) {
    plVar2[2] = local_20;
    plVar2[3] = lStack_18;
  }
  else {
    *plVar2 = (long)local_30;
    plVar2[2] = local_20;
  }
  plVar2[1] = local_28;
  *(long **)&(__return_storage_ptr__->super__Function_base)._M_functor = plVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/FileReceiveSession.cpp:45:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/FileReceiveSession.cpp:45:10)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

TCPServer::SessionFactory FileReceiveSession::create_session_factory(boost::filesystem::path target) {
  return [=](Poll &p, TCPServer &server, sockaddr_in ad) -> std::shared_ptr<Subscriber> {
    p.unsubscribe(server);
    auto s = std::make_shared<FileReceiveSession>(target);
    s->when_error([](auto p) { std::cout << "Error in receiving file " << p << std::endl; });
    s->when_sucess([](auto p) { std::cout << "Received file " << p << std::endl; });
    return s;
  };
}